

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O3

QList<QByteArrayView> * __thiscall
QTimeZonePrivate::matchingTimeZoneIds
          (QList<QByteArrayView> *__return_storage_ptr__,QTimeZonePrivate *this,Territory territory)

{
  QStringTokenizerBaseBase *pQVar1;
  long lVar2;
  undefined6 in_register_00000012;
  long lVar3;
  long in_FS_OFFSET;
  iterator __begin4;
  QByteArrayView local_a8;
  undefined1 local_98 [32];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QStringTokenizerBase<QLatin1String,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QByteArrayView *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if ((int)CONCAT62(in_register_00000012,territory) == 0x102) {
    lVar3 = 0;
    do {
      local_98._8_8_ = "Africa/Asmera" + *(ushort *)((long)&DAT_00596af4 + lVar3);
      local_98._0_8_ = (QStringTokenizerBase<QLatin1String,_QChar> *)0xffffffffffffffff;
      do {
        pQVar1 = &((QStringTokenizerBase<QLatin1String,_QChar> *)local_98._0_8_)->
                  super_QStringTokenizerBaseBase;
        local_98._0_8_ =
             (long)&(((QStringTokenizerBase<QLatin1String,_QChar> *)local_98._0_8_)->
                    super_QStringTokenizerBaseBase).m_sb.
                    super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
                    super_QFlagsStorage<Qt::SplitBehaviorFlags>.i + 1;
      } while ("Africa/Asmera"
               [(long)((long)&(pQVar1->m_sb).super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
                              super_QFlagsStorage<Qt::SplitBehaviorFlags>.i +
                      (ulong)*(ushort *)((long)&DAT_00596af4 + lVar3) + 1)] != '\0');
      QtPrivate::QPodArrayOps<QByteArrayView>::emplace<QByteArrayView>
                ((QPodArrayOps<QByteArrayView> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,(QByteArrayView *)local_98);
      QList<QByteArrayView>::end(__return_storage_ptr__);
      lVar3 = lVar3 + 0xc;
    } while (lVar3 != 0x684);
  }
  else {
    lVar3 = 0;
    do {
      if (*(Territory *)((long)&DAT_00596272 + lVar3) == territory) {
        local_58.m_haystack.m_data = "Asia/Kabul" + *(ushort *)((long)&DAT_00596274 + lVar3);
        local_58.m_haystack.m_size = -1;
        do {
          lVar2 = local_58.m_haystack.m_size + (ulong)*(ushort *)((long)&DAT_00596274 + lVar3) + 1;
          local_58.m_haystack.m_size = local_58.m_haystack.m_size + 1;
        } while ("Asia/Kabul"[lVar2] != '\0');
        local_58.super_QStringTokenizerBaseBase.m_sb.
        super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
        super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
             (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
        local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
        local_58.m_needle.ucs = L' ';
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator
                  ((iterator *)local_98,&local_58);
        if (local_98[0x18] == true) {
          do {
            local_a8.m_size = local_98._8_8_;
            local_a8.m_data = (storage_type *)local_98._16_8_;
            QtPrivate::QPodArrayOps<QByteArrayView>::emplace<QByteArrayView>
                      ((QPodArrayOps<QByteArrayView> *)__return_storage_ptr__,
                       (__return_storage_ptr__->d).size,&local_a8);
            QList<QByteArrayView>::end(__return_storage_ptr__);
            QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance((iterator *)local_98);
          } while (local_98[0x18] != false);
        }
      }
      lVar3 = lVar3 + 6;
    } while (lVar3 != 0x876);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QByteArrayView> QTimeZonePrivate::matchingTimeZoneIds(QLocale::Territory territory) const
{
    // Default fall-back mode: use the CLDR data to find zones for this territory.
    QList<QByteArrayView> regions;
#if QT_CONFIG(timezone_locale) && !QT_CONFIG(icu)
    regions = QtTimeZoneLocale::ianaIdsForTerritory(territory);
#endif
    // Get all Zones in the table associated with this territory:
    if (territory == QLocale::World) {
        // World names are filtered out of zoneDataTable to provide the defaults
        // in windowsDataTable.
        for (const WindowsData &data : windowsDataTable)
            regions << data.ianaId();
    } else {
        for (const ZoneData &data : zoneDataTable) {
            if (data.territory == territory) {
                for (auto l1 : data.ids())
                    regions << QByteArrayView(l1.data(), l1.size());
            }
        }
    }
    return regions;
}